

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void str_hex(char *dst,int dst_size,void *data,int data_size)

{
  int b;
  int data_size_local;
  void *data_local;
  int dst_size_local;
  char *dst_local;
  
  for (b = 0; b < data_size && b < dst_size / 4 + -4; b = b + 1) {
    dst[b * 3] = "0123456789ABCDEF"[(int)(uint)*(byte *)((long)data + (long)b) >> 4];
    dst[b * 3 + 1] = "0123456789ABCDEF"[(int)(*(byte *)((long)data + (long)b) & 0xf)];
    dst[b * 3 + 2] = ' ';
    dst[b * 3 + 3] = '\0';
  }
  return;
}

Assistant:

void str_hex(char *dst, int dst_size, const void *data, int data_size)
{
	static const char hex[] = "0123456789ABCDEF";
	int b;

	for(b = 0; b < data_size && b < dst_size/4-4; b++)
	{
		dst[b*3] = hex[((const unsigned char *)data)[b]>>4];
		dst[b*3+1] = hex[((const unsigned char *)data)[b]&0xf];
		dst[b*3+2] = ' ';
		dst[b*3+3] = 0;
	}
}